

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O1

void Parser::MapBindIdentifier<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
               (ParseNodePtr patternNode,anon_class_16_2_de35cfdd handler)

{
  ParseNode *pPVar1;
  code *pcVar2;
  bool bVar3;
  ParseNodePtr in_RAX;
  ParseNodeBin *pPVar4;
  undefined4 *puVar5;
  ParseNodeArrLit *pPVar6;
  ParseNodeUni *pPVar7;
  ParseNodePtr *ppPVar8;
  char *in_RCX;
  ParseNodePtr elementNode;
  Parser *this;
  ParseNodePtr *ppPVar9;
  anon_class_16_2_de35cfdd handler_00;
  anon_class_16_2_de35cfdd handler_01;
  anon_class_16_2_de35cfdd handler_02;
  anon_class_16_2_de35cfdd handler_03;
  ParseNodePtr local_38;
  
  handler_00.top = (FuncInfo **)handler.i;
  elementNode = (ParseNodePtr)handler.top;
  local_38 = in_RAX;
  if (patternNode->nop == knopAsg) {
    pPVar4 = ParseNode::AsParseNodeBin(patternNode);
    patternNode = pPVar4->pnode1;
  }
  if ((patternNode->nop & ~knopInt) != knopObjectPattern) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    in_RCX = "patternNode->IsPattern()";
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2e8,"(patternNode->IsPattern())","patternNode->IsPattern()");
    if (!bVar3) {
LAB_00839a13:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (patternNode->nop == knopArrayPattern) {
    pPVar6 = ParseNode::AsParseNodeArrLit(patternNode);
    ppPVar9 = &local_38;
    local_38 = (pPVar6->super_ParseNodeUni).pnode1;
    do {
      pPVar1 = *ppPVar9;
      if (pPVar1 == (ParseNode *)0x0) {
        return;
      }
      if (pPVar1->nop == knopList) {
        pPVar4 = ParseNode::AsParseNodeBin(pPVar1);
        handler_00.i = (uint *)in_RCX;
        MapBindIdentifierFromElement<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
                  ((Parser *)pPVar4->pnode1,elementNode,handler_00);
        pPVar4 = ParseNode::AsParseNodeBin(*ppPVar9);
        ppPVar9 = &pPVar4->pnode2;
      }
      else {
        handler_01.i = (uint *)in_RCX;
        handler_01.top = handler_00.top;
        MapBindIdentifierFromElement<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
                  ((Parser *)*ppPVar9,elementNode,handler_01);
        ppPVar9 = (ParseNodePtr *)0x0;
      }
    } while (ppPVar9 != (ParseNodePtr *)0x0);
  }
  else {
    pPVar7 = ParseNode::AsParseNodeUni(patternNode);
    local_38 = pPVar7->pnode1;
    ppPVar9 = &local_38;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      pPVar1 = *ppPVar9;
      if (pPVar1 == (ParseNode *)0x0) {
        return;
      }
      if (pPVar1->nop == knopList) {
        pPVar4 = ParseNode::AsParseNodeBin(pPVar1);
        pPVar1 = pPVar4->pnode1;
        if ((pPVar1->nop != knopEllipsis) && (pPVar1->nop != knopObjectPatternMember)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          in_RCX = "item->nop == knopObjectPatternMember || item->nop == knopEllipsis";
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                             ,0x2f2,
                             "(item->nop == knopObjectPatternMember || item->nop == knopEllipsis)",
                             "item->nop == knopObjectPatternMember || item->nop == knopEllipsis");
          if (!bVar3) goto LAB_00839a13;
          *puVar5 = 0;
        }
        if (pPVar1->nop == knopObjectPatternMember) {
          pPVar4 = ParseNode::AsParseNodeBin(pPVar1);
          ppPVar8 = &pPVar4->pnode2;
        }
        else {
          pPVar7 = ParseNode::AsParseNodeUni(pPVar1);
          ppPVar8 = &pPVar7->pnode1;
        }
        handler_02.i = (uint *)in_RCX;
        handler_02.top = handler_00.top;
        MapBindIdentifierFromElement<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
                  ((Parser *)*ppPVar8,elementNode,handler_02);
        pPVar4 = ParseNode::AsParseNodeBin(*ppPVar9);
        ppPVar9 = &pPVar4->pnode2;
      }
      else {
        pPVar1 = *ppPVar9;
        if ((pPVar1->nop != knopEllipsis) && (pPVar1->nop != knopObjectPatternMember)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          in_RCX = "item->nop == knopObjectPatternMember || item->nop == knopEllipsis";
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                             ,0x2f2,
                             "(item->nop == knopObjectPatternMember || item->nop == knopEllipsis)",
                             "item->nop == knopObjectPatternMember || item->nop == knopEllipsis");
          if (!bVar3) goto LAB_00839a13;
          *puVar5 = 0;
        }
        if (pPVar1->nop == knopObjectPatternMember) {
          pPVar4 = ParseNode::AsParseNodeBin(pPVar1);
          this = (Parser *)pPVar4->pnode2;
        }
        else {
          pPVar7 = ParseNode::AsParseNodeUni(pPVar1);
          this = (Parser *)pPVar7->pnode1;
        }
        handler_03.i = (uint *)in_RCX;
        handler_03.top = handler_00.top;
        MapBindIdentifierFromElement<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
                  (this,elementNode,handler_03);
        ppPVar9 = (ParseNodePtr *)0x0;
      }
    } while (ppPVar9 != (ParseNodePtr *)0x0);
  }
  return;
}

Assistant:

static void MapBindIdentifier(ParseNodePtr patternNode, THandler handler)
    {
        if (patternNode->nop == knopAsg)
        {
            patternNode = patternNode->AsParseNodeBin()->pnode1;
        }

        Assert(patternNode->IsPattern());
        if (patternNode->nop == knopArrayPattern)
        {
            ForEachItemInList(patternNode->AsParseNodeArrLit()->pnode1, [&](ParseNodePtr item) {
                MapBindIdentifierFromElement(item, handler);
            });
        }
        else
        {
            ForEachItemInList(patternNode->AsParseNodeUni()->pnode1, [&](ParseNodePtr item) {
                Assert(item->nop == knopObjectPatternMember || item->nop == knopEllipsis);
                if (item->nop == knopObjectPatternMember)
                {
                    MapBindIdentifierFromElement(item->AsParseNodeBin()->pnode2, handler);
                }
                else
                {
                    MapBindIdentifierFromElement(item->AsParseNodeUni()->pnode1, handler);
                }
            });
        }
    }